

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall cmTarget::AppendProperty(cmTarget *this,string *prop,char *value,bool asString)

{
  cmMakefile *pcVar1;
  cmTargetInternals *pcVar2;
  bool bVar3;
  ostream *poVar4;
  allocator local_1b9;
  string local_1b8;
  ostringstream e;
  
  if ((this->TargetTypeValue != INTERFACE_LIBRARY) ||
     (bVar3 = whiteListedInterfaceProperty(prop), bVar3)) {
    bVar3 = std::operator==(prop,"NAME");
    if (!bVar3) {
      bVar3 = std::operator==(prop,"INCLUDE_DIRECTORIES");
      if (bVar3) {
        if (value == (char *)0x0) {
          return;
        }
        if (*value == '\0') {
          return;
        }
        pcVar2 = (this->Internal).Pointer;
        std::__cxx11::string::string((string *)&e,value,(allocator *)&local_1b8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pcVar2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
        std::__cxx11::string::~string((string *)&e);
        cmMakefile::GetBacktrace((cmListFileBacktrace *)&e,this->Makefile);
        std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                  (&((this->Internal).Pointer)->IncludeDirectoriesBacktraces,
                   (cmListFileBacktrace *)&e);
      }
      else {
        bVar3 = std::operator==(prop,"COMPILE_OPTIONS");
        if (bVar3) {
          if (value == (char *)0x0) {
            return;
          }
          if (*value == '\0') {
            return;
          }
          pcVar2 = (this->Internal).Pointer;
          std::__cxx11::string::string((string *)&e,value,(allocator *)&local_1b8);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &pcVar2->CompileOptionsEntries,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
          std::__cxx11::string::~string((string *)&e);
          cmMakefile::GetBacktrace((cmListFileBacktrace *)&e,this->Makefile);
          std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                    (&((this->Internal).Pointer)->CompileOptionsBacktraces,(cmListFileBacktrace *)&e
                    );
        }
        else {
          bVar3 = std::operator==(prop,"COMPILE_FEATURES");
          if (bVar3) {
            if (value == (char *)0x0) {
              return;
            }
            if (*value == '\0') {
              return;
            }
            pcVar2 = (this->Internal).Pointer;
            std::__cxx11::string::string((string *)&e,value,(allocator *)&local_1b8);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &pcVar2->CompileFeaturesEntries,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
            std::__cxx11::string::~string((string *)&e);
            cmMakefile::GetBacktrace((cmListFileBacktrace *)&e,this->Makefile);
            std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                      (&((this->Internal).Pointer)->CompileFeaturesBacktraces,
                       (cmListFileBacktrace *)&e);
          }
          else {
            bVar3 = std::operator==(prop,"COMPILE_DEFINITIONS");
            if (bVar3) {
              if (value == (char *)0x0) {
                return;
              }
              if (*value == '\0') {
                return;
              }
              pcVar2 = (this->Internal).Pointer;
              std::__cxx11::string::string((string *)&e,value,(allocator *)&local_1b8);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &pcVar2->CompileDefinitionsEntries,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
              std::__cxx11::string::~string((string *)&e);
              cmMakefile::GetBacktrace((cmListFileBacktrace *)&e,this->Makefile);
              std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                        (&((this->Internal).Pointer)->CompileDefinitionsBacktraces,
                         (cmListFileBacktrace *)&e);
            }
            else {
              bVar3 = std::operator==(prop,"EXPORT_NAME");
              if ((bVar3) && (this->IsImportedTarget == true)) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
                poVar4 = std::operator<<((ostream *)&e,
                                         "EXPORT_NAME property can\'t be set on imported targets (\""
                                        );
                poVar4 = std::operator<<(poVar4,(string *)&this->Name);
                std::operator<<(poVar4,"\")\n");
                pcVar1 = this->Makefile;
                std::__cxx11::stringbuf::str();
                cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1b8,false);
                goto LAB_0031c935;
              }
              bVar3 = std::operator==(prop,"LINK_LIBRARIES");
              if (bVar3) {
                if (value == (char *)0x0) {
                  return;
                }
                if (*value == '\0') {
                  return;
                }
                cmMakefile::GetBacktrace((cmListFileBacktrace *)&e,this->Makefile);
                pcVar2 = (this->Internal).Pointer;
                std::__cxx11::string::string((string *)&local_1b8,value,&local_1b9);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &pcVar2->LinkImplementationPropertyEntries,&local_1b8);
                std::__cxx11::string::~string((string *)&local_1b8);
                std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                          (&((this->Internal).Pointer)->LinkImplementationPropertyBacktraces,
                           (value_type *)&e);
              }
              else {
                bVar3 = std::operator==(prop,"SOURCES");
                if (!bVar3) {
                  cmPropertyMap::AppendProperty(&this->Properties,prop,value,asString);
                  return;
                }
                if (this->IsImportedTarget == true) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
                  poVar4 = std::operator<<((ostream *)&e,
                                           "SOURCES property can\'t be set on imported targets (\"")
                  ;
                  poVar4 = std::operator<<(poVar4,(string *)&this->Name);
                  std::operator<<(poVar4,"\")\n");
                  pcVar1 = this->Makefile;
                  std::__cxx11::stringbuf::str();
                  cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1b8,false);
                  goto LAB_0031c935;
                }
                cmMakefile::GetBacktrace((cmListFileBacktrace *)&e,this->Makefile);
                pcVar2 = (this->Internal).Pointer;
                std::__cxx11::string::string((string *)&local_1b8,value,&local_1b9);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &pcVar2->SourceEntries,&local_1b8);
                std::__cxx11::string::~string((string *)&local_1b8);
                std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                          (&((this->Internal).Pointer)->SourceBacktraces,(value_type *)&e);
              }
            }
          }
        }
      }
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&e);
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    std::operator<<((ostream *)&e,"NAME property is read-only\n");
    pcVar1 = this->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1b8,false);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar4 = std::operator<<((ostream *)&e,
                             "INTERFACE_LIBRARY targets may only have whitelisted properties.  The property \""
                            );
    poVar4 = std::operator<<(poVar4,(string *)prop);
    std::operator<<(poVar4,"\" is not allowed.");
    pcVar1 = this->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1b8,false);
  }
LAB_0031c935:
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  return;
}

Assistant:

void cmTarget::AppendProperty(const std::string& prop, const char* value,
                              bool asString)
{
  if (this->GetType() == cmState::INTERFACE_LIBRARY
      && !whiteListedInterfaceProperty(prop))
    {
    std::ostringstream e;
    e << "INTERFACE_LIBRARY targets may only have whitelisted properties.  "
         "The property \"" << prop << "\" is not allowed.";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
    }
  else if (prop == "NAME")
    {
    std::ostringstream e;
    e << "NAME property is read-only\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
    }
  else if(prop == "INCLUDE_DIRECTORIES")
    {
    if (value && *value)
      {
      this->Internal->IncludeDirectoriesEntries.push_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->IncludeDirectoriesBacktraces.push_back(lfbt);
      }
    }
  else if(prop == "COMPILE_OPTIONS")
    {
    if (value && *value)
      {
      this->Internal->CompileOptionsEntries.push_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileOptionsBacktraces.push_back(lfbt);
      }
    }
  else if(prop == "COMPILE_FEATURES")
    {
    if (value && *value)
      {
      this->Internal->CompileFeaturesEntries.push_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileFeaturesBacktraces.push_back(lfbt);
      }
    }
  else if(prop == "COMPILE_DEFINITIONS")
    {
    if (value && *value)
      {
      this->Internal->CompileDefinitionsEntries.push_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileDefinitionsBacktraces.push_back(lfbt);
      }
    }
  else if(prop == "EXPORT_NAME" && this->IsImported())
    {
    std::ostringstream e;
    e << "EXPORT_NAME property can't be set on imported targets (\""
          << this->Name << "\")\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    }
  else if (prop == "LINK_LIBRARIES")
    {
    if (value && *value)
      {
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->LinkImplementationPropertyEntries.push_back(value);
      this->Internal->LinkImplementationPropertyBacktraces.push_back(lfbt);
      }
    }
  else if (prop == "SOURCES")
    {
    if(this->IsImported())
      {
      std::ostringstream e;
      e << "SOURCES property can't be set on imported targets (\""
            << this->Name << "\")\n";
      this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
      return;
      }
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    this->Internal->SourceEntries.push_back(value);
    this->Internal->SourceBacktraces.push_back(lfbt);
    }
  else
    {
    this->Properties.AppendProperty(prop, value, asString);
    }
}